

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

int Gia_VtaPerformInt(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  byte bVar1;
  uint uVar2;
  sat_solver2 *psVar3;
  Vec_Set_t *pVVar4;
  uint *__dest;
  int **ppiVar5;
  Vec_Ptr_t *pVVar6;
  Abc_Cex_t *__ptr;
  Abs_Par_t *pAVar7;
  ABC_INT64_T AVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  Vta_Man_t *p;
  long lVar15;
  Abc_Cex_t *pAVar16;
  Abs_Par_t *pAVar17;
  void **ppvVar18;
  Abc_Frame_t *pAbc;
  abctime aVar19;
  ulong uVar20;
  int nFrames;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  size_t __size;
  char *pcVar25;
  Gia_Man_t *pGVar26;
  Vta_Man_t *pVVar27;
  Vec_Vec_t *vFrames;
  int iVar28;
  double dVar29;
  int Status;
  int nConfls;
  timespec ts;
  long local_468;
  int local_45c;
  Abs_Par_t *local_458;
  int local_44c;
  Vec_Int_t *local_448;
  int local_440;
  int local_43c;
  Gia_Man_t *local_438;
  int local_42c;
  long local_428;
  long local_420;
  timespec local_418 [62];
  
  iVar9 = clock_gettime(3,local_418);
  if (iVar9 < 0) {
    local_468 = -1;
  }
  else {
    local_468 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  iVar9 = pAig->vCos->nSize;
  if (iVar9 - pAig->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x5dc,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  if ((pPars->nFramesMax != 0) && (pPars->nFramesMax < pPars->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x5dd,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  if (iVar9 <= pAig->nRegs) {
LAB_0061ea25:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar9 < 1) {
LAB_0061ea44:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar9 = *pAig->vCos->pArray;
  if (((long)iVar9 < 0) || (pAig->nObjs <= iVar9)) {
LAB_0061ea06:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar10 = (uint)*(undefined8 *)(pAig->pObjs + iVar9);
  if ((~*(ulong *)(pAig->pObjs + iVar9 + -(ulong)(uVar10 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0)
  {
    if ((uVar10 >> 0x1d & 1) == 0) {
      puts("Sequential miter is trivially UNSAT.");
      return 1;
    }
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pAVar16 = Abc_CexMakeTriv(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,1,0);
    pAig->pCexSeq = pAVar16;
    puts("Sequential miter is trivially SAT.");
    return 0;
  }
  if (pAig->vObjClasses == (Vec_Int_t *)0x0) {
    pVVar13 = (Vec_Int_t *)malloc(0x10);
    pVVar13->nCap = 0x10;
    pVVar13->nSize = 0;
    piVar14 = (int *)malloc(0x40);
    pVVar13->pArray = piVar14;
    pAig->vObjClasses = pVVar13;
    Vec_IntPush(pVVar13,1);
    Vec_IntPush(pAig->vObjClasses,3);
    Vec_IntPush(pAig->vObjClasses,4);
    iVar9 = pAig->vCos->nSize;
    if (iVar9 <= pAig->nRegs) goto LAB_0061ea25;
    if (iVar9 < 1) goto LAB_0061ea44;
    iVar9 = *pAig->vCos->pArray;
    if (((long)iVar9 < 0) || (pAig->nObjs <= iVar9)) goto LAB_0061ea06;
    Vec_IntPush(pAig->vObjClasses,iVar9 - (*(uint *)(pAig->pObjs + iVar9) & 0x1fffffff));
  }
  pGVar26 = pAig;
  p = Vga_ManStart(pAig,pPars);
  iVar9 = (int)pGVar26;
  lVar15 = (long)p->pPars->nTimeOut;
  if (lVar15 != 0) {
    psVar3 = p->pSat;
    iVar9 = 3;
    iVar11 = clock_gettime(3,local_418);
    if (iVar11 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    psVar3->nRuntimeLimit = lVar21 + lVar15 * 1000000;
  }
  if (p->pPars->fVerbose != 0) {
    Abc_Print(iVar9,"Running variable-timeframe abstraction (VTA) with the following parameters:\n")
    ;
    Abc_Print(iVar9,"FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n",
              (ulong)(uint)pPars->nFramesPast,(ulong)(uint)pPars->nFramesMax,
              (ulong)(uint)pPars->nConfLimit,(ulong)(uint)pPars->nTimeOut,pPars->nRatioMin);
    Abc_Print(iVar9,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pPars->nLearnedStart,(ulong)(uint)pPars->nLearnedDelta,
              (ulong)(uint)pPars->nLearnedPerce);
    Abc_Print(iVar9,
              " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n")
    ;
  }
  if (p->vFrames->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vFrames) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x604,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  pAVar17 = p->pPars;
  local_458 = pPars;
  if (pAVar17->nFramesMax < 0) {
    pAVar16 = (Abc_Cex_t *)0x0;
    uVar23 = 0;
  }
  else {
    local_428 = -1;
    local_440 = 0;
    local_44c = 0;
    pAVar16 = (Abc_Cex_t *)0x0;
    uVar22 = 0;
    local_438 = pAig;
    do {
      local_43c = (int)(p->pSat->stats).conflicts;
      iVar11 = (int)uVar22;
      pAVar17->iFrame = iVar11;
      if (uVar22 == (uint)(p->nWords << 5)) {
        iVar9 = Vec_IntDoubleWidth(p->vSeens,p->nWords);
        p->nWords = iVar9;
      }
      psVar3 = p->pSat;
      if (psVar3->qhead != psVar3->qtail) {
        __assert_fail("s->qhead == s->qtail",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                      ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
      }
      local_448 = (Vec_Int_t *)CONCAT44(local_448._4_4_,p->nObjs);
      iVar9 = psVar3->size;
      psVar3->iVarPivot = iVar9;
      psVar3->iTrailPivot = psVar3->qhead;
      pVVar4 = psVar3->pPrf1;
      if (pVVar4 != (Vec_Set_t *)0x0) {
        psVar3->hProofPivot =
             (pVVar4->iPage << ((byte)pVVar4->nPageSize & 0x1f)) +
             (int)*pVVar4->pPages[pVVar4->iPage];
      }
      __dest = psVar3->activity2;
      *(undefined8 *)(psVar3->Mem).BookMarkE = *(undefined8 *)(psVar3->Mem).nEntries;
      iVar28 = (psVar3->Mem).iPage[0];
      bVar1 = (byte)(psVar3->Mem).nPageSize;
      ppiVar5 = (psVar3->Mem).pPages;
      (psVar3->Mem).BookMarkH[0] = iVar28 << (bVar1 & 0x1f) | *ppiVar5[iVar28];
      iVar28 = (psVar3->Mem).iPage[1];
      (psVar3->Mem).BookMarkH[1] = iVar28 << (bVar1 & 0x1f) | *ppiVar5[iVar28];
      if (__dest != (uint *)0x0) {
        psVar3->var_inc2 = psVar3->var_inc;
        memcpy(__dest,psVar3->activity,(long)iVar9 << 2);
      }
      p->vAddedNew->nSize = 0;
      Vga_ManAddClausesOne(p,0,iVar11);
      if ((long)uVar22 < (long)p->vFrames->nSize) {
        Vga_ManLoadSlice(p,(Vec_Int_t *)p->vFrames->pArray[uVar22],0);
      }
      else {
        iVar9 = p->pPars->nFramesPast;
        if (iVar11 <= iVar9) {
          iVar9 = iVar11;
        }
        if (0 < iVar9) {
          uVar23 = 0;
          lVar15 = local_428;
          do {
            if ((uVar22 == uVar23) || (p->vCores->nSize <= lVar15)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar23 = uVar23 + 1;
            Vga_ManLoadSlice(p,(Vec_Int_t *)p->vCores->pArray[lVar15],(int)uVar23);
            iVar9 = p->pPars->nFramesPast;
            if (iVar11 <= iVar9) {
              iVar9 = iVar11;
            }
            lVar15 = lVar15 + -1;
          } while ((long)uVar23 < (long)iVar9);
        }
      }
      uVar23 = uVar22 + 1;
      iVar28 = 0;
      while( true ) {
        iVar9 = clock_gettime(3,local_418);
        if (iVar9 < 0) {
          lVar15 = 1;
        }
        else {
          lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_418[0].tv_nsec),8);
          lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_418[0].tv_sec * -1000000;
        }
        iVar9 = Vga_ManGetOutLit(p,iVar11);
        pVVar13 = Vta_ManUnsatCore(iVar9,p->pSat,local_458->nConfLimit,(int)local_458,&local_45c,
                                   &local_42c);
        if ((local_45c != 1) == (pVVar13 != (Vec_Int_t *)0x0)) {
          __assert_fail("(vCore != NULL) == (Status == 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x621,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
        }
        nFrames = (int)uVar23;
        if (local_45c == -1) break;
        if (p->pSat->nRuntimeLimit != 0) {
          iVar9 = clock_gettime(3,local_418);
          if (iVar9 < 0) {
            lVar21 = -1;
          }
          else {
            lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
          }
          if (p->pSat->nRuntimeLimit < lVar21) break;
        }
        if (pVVar13 != (Vec_Int_t *)0x0) {
          iVar9 = clock_gettime(3,local_418);
          if (iVar9 < 0) {
            lVar21 = -1;
          }
          else {
            lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
          }
          p->timeUnsat = p->timeUnsat + lVar21 + lVar15;
          if (local_45c != 1) {
            __assert_fail("Status == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x63e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
          }
          Vta_ManUnsatCoreRemap(p,pVVar13);
          qsort(pVVar13->pArray,(long)pVVar13->nSize,4,Vec_IntSortCompare2);
          sat_solver2_rollback(p->pSat);
          Vga_ManRollBack(p,(int)local_448);
          Vga_ManLoadSlice(p,pVVar13,0);
          if (pVVar13->pArray != (int *)0x0) {
            free(pVVar13->pArray);
            pVVar13->pArray = (int *)0x0;
          }
          free(pVVar13);
          iVar9 = clock_gettime(3,local_418);
          if (iVar9 < 0) {
            lVar15 = 1;
          }
          else {
            lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_418[0].tv_nsec),8);
            lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_418[0].tv_sec * -1000000;
          }
          iVar9 = Vga_ManGetOutLit(p,iVar11);
          local_448 = Vta_ManUnsatCore(iVar9,p->pSat,local_458->nConfLimit,(int)local_458,&local_45c
                                       ,&local_42c);
          iVar9 = 3;
          iVar11 = clock_gettime(3,local_418);
          pVVar13 = local_448;
          if (iVar11 < 0) {
            lVar21 = -1;
          }
          else {
            lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
          }
          p->timeUnsat = p->timeUnsat + lVar21 + lVar15;
          if ((local_45c != 1) == (local_448 != (Vec_Int_t *)0x0)) {
            __assert_fail("(vCore != NULL) == (Status == 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x64e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
          }
          iVar11 = 2;
          if (local_45c != -1) {
            if (local_45c == 0) {
              Vta_ManSatVerify(p);
              if ((local_438->vObjClasses != (Vec_Int_t *)0x0) ||
                 ((long)p->pPars->nFramesStart <= (long)uVar22)) {
                __assert_fail("pAig->vObjClasses == NULL && f < p->pPars->nFramesStart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x655,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
              }
              pVVar27 = p;
              pAVar16 = Vga_ManDeriveCex(p);
              iVar9 = (int)pVVar27;
            }
            else {
              Vta_ManUnsatCoreRemap(p,local_448);
              qsort(pVVar13->pArray,(long)pVVar13->nSize,4,Vec_IntSortCompare2);
              pVVar6 = p->vCores;
              uVar10 = pVVar6->nCap;
              if (pVVar6->nSize == uVar10) {
                if ((int)uVar10 < 0x10) {
                  if (pVVar6->pArray == (void **)0x0) {
                    ppvVar18 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar18 = (void **)realloc(pVVar6->pArray,0x80);
                  }
                  pVVar6->pArray = ppvVar18;
                  iVar9 = 0x10;
                }
                else {
                  lVar15 = (ulong)uVar10 * 2;
                  if ((int)lVar15 <= (int)uVar10) goto LAB_0061ddda;
                  __size = (ulong)uVar10 << 4;
                  local_420 = lVar15;
                  if (pVVar6->pArray == (void **)0x0) {
                    ppvVar18 = (void **)malloc(__size);
                  }
                  else {
                    ppvVar18 = (void **)realloc(pVVar6->pArray,__size);
                  }
                  pVVar6->pArray = ppvVar18;
                  iVar9 = (int)local_420;
                }
                pVVar6->nCap = iVar9;
              }
LAB_0061ddda:
              iVar9 = pVVar6->nSize;
              pVVar6->nSize = iVar9 + 1;
              pVVar6->pArray[iVar9] = local_448;
              AVar8 = (p->pSat->stats).conflicts;
              iVar9 = clock_gettime(3,local_418);
              if (iVar9 < 0) {
                lVar15 = -1;
              }
              else {
                lVar15 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
              }
              pVVar13 = local_448;
              pVVar27 = p;
              iVar9 = Vta_ManAbsPrintFrame
                                (p,local_448,nFrames,(int)AVar8 - local_43c,iVar28,
                                 lVar15 - local_468,p->pPars->fVerbose);
              iVar28 = (int)pVVar13;
              if (iVar9 == 0) {
                iVar9 = local_44c + 1;
                if (local_44c + 1 == 2) {
                  piVar14 = &p->pPars->nFramesNoChange;
                  *piVar14 = *piVar14 + 1;
                  iVar9 = Abc_FrameIsBridgeMode();
                  if (iVar9 == 0) {
                    local_44c = 2;
                    iVar9 = local_44c;
                  }
                  else {
                    local_44c = 2;
                    if (local_440 != 0) {
                      Gia_VtaSendCancel(pVVar27,iVar28);
                    }
                    pVVar27 = p;
                    Gia_VtaSendAbsracted(p,iVar28);
                    local_440 = 1;
                    iVar9 = local_44c;
                  }
                }
              }
              else {
                p->pPars->nFramesNoChange = 0;
                local_44c = 1;
                iVar9 = local_44c;
              }
              local_44c = iVar9;
              iVar9 = (int)pVVar27;
              if ((uVar22 & 1) != 0 && p->pPars->fDumpVabs != 0) {
                Abc_FrameSetStatus(-1);
                Abc_FrameSetCex((Abc_Cex_t *)0x0);
                Abc_FrameSetNFrames(nFrames);
                pcVar25 = p->pPars->pFileVabs;
                if (pcVar25 == (char *)0x0) {
                  pcVar25 = "vtabs.aig";
                }
                pcVar25 = Extra_FileNameGenericAppend(pcVar25,".status");
                sprintf((char *)local_418,"write_status %s",pcVar25);
                pAbc = Abc_FrameGetGlobalFrame();
                Cmd_CommandExecute(pAbc,(char *)local_418);
                pVVar27 = p;
                Gia_VtaDumpAbsracted(p,local_458->fVerbose);
                iVar9 = (int)pVVar27;
              }
              iVar28 = local_438->vCis->nSize;
              if (p->nSeenGla <
                  ((100 - local_458->nRatioMin) *
                  (iVar28 + local_438->nObjs + ~(local_438->vCos->nSize + iVar28))) / 100) {
                iVar11 = 0;
              }
              else {
                local_45c = -1;
              }
            }
          }
          goto LAB_0061db26;
        }
        iVar9 = clock_gettime(3,local_418);
        if (iVar9 < 0) {
          lVar21 = -1;
        }
        else {
          lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
        }
        p->timeSat = p->timeSat + lVar21 + lVar15;
        if (local_45c != 0) {
          __assert_fail("Status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x633,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
        }
        p->nCexes = p->nCexes + 1;
        iVar9 = clock_gettime(3,local_418);
        if (iVar9 < 0) {
          lVar15 = 1;
        }
        else {
          lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_418[0].tv_nsec),8);
          lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_418[0].tv_sec * -1000000;
        }
        pAVar16 = Vta_ManRefineAbstraction(p,iVar11);
        iVar9 = 3;
        iVar12 = clock_gettime(3,local_418);
        if (iVar12 < 0) {
          lVar21 = -1;
        }
        else {
          lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
        }
        p->timeCex = p->timeCex + lVar21 + lVar15;
        if (pAVar16 != (Abc_Cex_t *)0x0) goto LAB_0061db1c;
        AVar8 = (p->pSat->stats).conflicts;
        iVar9 = clock_gettime(3,local_418);
        if (iVar9 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
        }
        Vta_ManAbsPrintFrame
                  (p,(Vec_Int_t *)0x0,nFrames,(int)AVar8 - local_43c,iVar28,lVar15 - local_468,
                   p->pPars->fVerbose);
        iVar28 = iVar28 + 1;
        pAVar16 = (Abc_Cex_t *)0x0;
      }
      pVVar27 = p;
      Vga_ManRollBack(p,(int)local_448);
      iVar9 = (int)pVVar27;
LAB_0061db1c:
      iVar11 = 0xb;
LAB_0061db26:
      pAig = local_438;
      if (iVar11 != 0) {
        uVar23 = uVar22;
        if ((iVar11 != 2) && (iVar11 != 0xb)) {
          return iVar11;
        }
        break;
      }
      pAVar17 = p->pPars;
      local_428 = local_428 + 1;
      uVar22 = uVar23;
    } while (nFrames < pAVar17->nFramesMax || pAVar17->nFramesMax == 0);
  }
  iVar11 = p->pPars->fVerbose;
  if (pAVar16 != (Abc_Cex_t *)0x0) {
    if (iVar11 != 0) {
      putchar(10);
    }
    __ptr = p->pGia->pCexSeq;
    if (__ptr != (Abc_Cex_t *)0x0) {
      free(__ptr);
      p->pGia->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pGVar26 = p->pGia;
    pGVar26->pCexSeq = pAVar16;
    iVar9 = 0;
    iVar11 = Gia_ManVerifyCex(pGVar26,pAVar16,0);
    iVar28 = (int)pGVar26;
    if (iVar11 == 0) {
      Abc_Print(iVar28,"    Gia_VtaPerform(): CEX verification has failed!\n");
    }
    Abc_Print(iVar28,"Counter-example detected in frame %d.  ",uVar23 & 0xffffffff);
    p->pPars->iFrame = pAVar16->iFrame + -1;
    if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
      piVar14 = pAig->vObjClasses->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
        pAig->vObjClasses->pArray = (int *)0x0;
      }
      if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
        free(pAig->vObjClasses);
        pAig->vObjClasses = (Vec_Int_t *)0x0;
      }
    }
    goto LAB_0061e25d;
  }
  if ((iVar11 != 0) && (local_45c == -1)) {
    iVar9 = 10;
    putchar(10);
  }
  pAVar17 = local_458;
  iVar11 = p->vCores->nSize;
  if (iVar11 == 0) {
    Abc_Print(iVar9,"Abstraction is not produced because first frame is not solved.  ");
  }
  else {
    if (iVar11 < 1) {
      __assert_fail("Vec_PtrSize(p->vCores) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x68e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
    }
    if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
      piVar14 = pAig->vObjClasses->pArray;
      if (piVar14 != (int *)0x0) {
        free(piVar14);
        pAig->vObjClasses->pArray = (int *)0x0;
      }
      if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
        free(pAig->vObjClasses);
        pAig->vObjClasses = (Vec_Int_t *)0x0;
      }
    }
    vFrames = (Vec_Vec_t *)p->vCores;
    pVVar13 = Gia_VtaFramesToAbs(vFrames);
    iVar9 = (int)vFrames;
    pAig->vObjClasses = pVVar13;
    pAVar7 = p->pPars;
    if (local_45c == -1) {
      if ((pAVar7->nTimeOut == 0) || (aVar19 = Abc_Clock(), aVar19 < p->pSat->nRuntimeLimit)) {
        uVar10 = pAVar17->nConfLimit;
        if ((uVar10 == 0) || ((int)(p->pSat->stats).conflicts < (int)uVar10)) {
          iVar11 = pAig->vCis->nSize;
          uVar10 = pAVar17->nRatioMin;
          uVar22 = (ulong)uVar10;
          if (p->nSeenGla <
              (int)((100 - uVar10) * (iVar11 + pAig->nObjs + ~(pAig->vCos->nSize + iVar11))) / 100)
          {
            Abc_Print(iVar9,"Abstraction stopped for unknown reason in frame %d.  ",
                      uVar23 & 0xffffffff);
            goto LAB_0061e258;
          }
          pcVar25 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
          uVar20 = uVar23 & 0xffffffff;
          goto LAB_0061e172;
        }
        uVar2 = p->pPars->nFramesNoChange;
        pcVar25 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
      }
      else {
        uVar10 = p->pPars->nTimeOut;
        uVar2 = p->pPars->nFramesNoChange;
        pcVar25 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
      }
      Abc_Print(iVar9,pcVar25,(ulong)uVar10,uVar23 & 0xffffffff,(ulong)uVar2);
    }
    else {
      pAVar7->iFrame = pAVar7->iFrame + 1;
      uVar20 = (ulong)(uint)pAVar7->nFramesNoChange;
      pcVar25 = "VTA completed %d frames with a %d-stable abstraction.  ";
      uVar22 = uVar23 & 0xffffffff;
LAB_0061e172:
      Abc_Print(iVar9,pcVar25,uVar22,uVar20);
    }
  }
LAB_0061e258:
  iVar9 = -1;
LAB_0061e25d:
  iVar28 = 3;
  iVar11 = clock_gettime(3,local_418);
  if (iVar11 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  Abc_Print(iVar28,"%s =","Time");
  Abc_Print(iVar28,"%9.2f sec\n",(double)(lVar15 - local_468) / 1000000.0);
  if (p->pPars->fVerbose != 0) {
    iVar28 = 3;
    iVar11 = clock_gettime(3,local_418);
    lVar21 = -1;
    lVar15 = -1;
    if (-1 < iVar11) {
      lVar15 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    p->timeOther = lVar15 - (p->timeUnsat + local_468 + p->timeSat + p->timeCex);
    Abc_Print(iVar28,"%s =","Runtime: Solver UNSAT");
    lVar15 = p->timeUnsat;
    iVar28 = 3;
    iVar11 = clock_gettime(3,local_418);
    if (-1 < iVar11) {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != local_468) {
      local_458 = (Abs_Par_t *)((double)p->timeUnsat * 100.0);
      iVar28 = 3;
      iVar11 = clock_gettime(3,local_418);
      if (iVar11 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = (double)local_458 / (double)(lVar21 - local_468);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",(double)lVar15 / 1000000.0,dVar29);
    Abc_Print(iVar28,"%s =","Runtime: Solver SAT  ");
    lVar15 = p->timeSat;
    iVar28 = 3;
    iVar11 = clock_gettime(3,local_418);
    if (iVar11 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != local_468) {
      local_458 = (Abs_Par_t *)((double)p->timeSat * 100.0);
      iVar28 = 3;
      iVar11 = clock_gettime(3,local_418);
      if (iVar11 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = (double)local_458 / (double)(lVar21 - local_468);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",(double)lVar15 / 1000000.0,dVar29);
    Abc_Print(iVar28,"%s =","Runtime: Refinement  ");
    lVar15 = p->timeCex;
    iVar28 = 3;
    iVar11 = clock_gettime(3,local_418);
    if (iVar11 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != local_468) {
      local_458 = (Abs_Par_t *)((double)p->timeCex * 100.0);
      iVar28 = 3;
      iVar11 = clock_gettime(3,local_418);
      if (iVar11 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = (double)local_458 / (double)(lVar21 - local_468);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",(double)lVar15 / 1000000.0,dVar29);
    Abc_Print(iVar28,"%s =","Runtime: Other       ");
    lVar15 = p->timeOther;
    iVar28 = 3;
    iVar11 = clock_gettime(3,local_418);
    if (iVar11 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != local_468) {
      local_458 = (Abs_Par_t *)((double)p->timeOther * 100.0);
      iVar28 = 3;
      iVar11 = clock_gettime(3,local_418);
      if (iVar11 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = (double)local_458 / (double)(lVar21 - local_468);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",(double)lVar15 / 1000000.0,dVar29);
    Abc_Print(iVar28,"%s =","Runtime: TOTAL       ");
    iVar11 = clock_gettime(3,local_418);
    lVar21 = -1;
    lVar15 = -1;
    if (-1 < iVar11) {
      lVar15 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    iVar28 = 3;
    iVar11 = clock_gettime(3,local_418);
    if (-1 < iVar11) {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != local_468) {
      iVar11 = clock_gettime(3,local_418);
      lVar24 = -1;
      lVar21 = -1;
      if (-1 < iVar11) {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      local_458 = (Abs_Par_t *)((double)(lVar21 - local_468) * 100.0);
      iVar28 = 3;
      iVar11 = clock_gettime(3,local_418);
      if (-1 < iVar11) {
        lVar24 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = (double)local_458 / (double)(lVar24 - local_468);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",(double)(lVar15 - local_468) / 1000000.0,dVar29);
    Gia_VtaPrintMemory(p);
  }
  Vga_ManStop(p);
  fflush(_stdout);
  return iVar9;
}

Assistant:

int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    Vec_Int_t * vCore;
    Abc_Cex_t * pCex = NULL;
    int i, f, nConfls, Status, nObjOld, RetValue = -1, nCountNoChange = 0, fOneIsSent = 0;
    abctime clk = Abc_Clock(), clk2;
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        } 
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vObjClasses == NULL )
    {
        pAig->vObjClasses = Vec_IntAlloc( 5 );
        Vec_IntPush( pAig->vObjClasses, 1 );
        Vec_IntPush( pAig->vObjClasses, 3 );
        Vec_IntPush( pAig->vObjClasses, 4 );
        Vec_IntPush( pAig->vObjClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)) );
    }
    // start the manager
    p = Vga_ManStart( pAig, pPars );
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running variable-timeframe abstraction (VTA) with the following parameters:\n" );
        Abc_Print( 1, "FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n", 
            pPars->nFramesPast, pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
//        Abc_Print( 1, "Frame   %%   Abs   %%   Confl  Cex    SatVar   Core   F0   F1   F2  ...\n" );
        Abc_Print( 1, " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n" );
    }
    assert( Vec_PtrSize(p->vFrames) > 0 );
    for ( f = i = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++ )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;
        // realloc storage for abstraction marks
        if ( f == p->nWords * 32 )
            p->nWords = Vec_IntDoubleWidth( p->vSeens, p->nWords );

        // create bookmark to be used for rollback
        nObjOld = p->nObjs;
        sat_solver2_bookmark( p->pSat );
        Vec_IntClear( p->vAddedNew );

        // load new timeframe
        Vga_ManAddClausesOne( p, 0, f );
        if ( f < Vec_PtrSize(p->vFrames) )
            Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vFrames, f), 0 );
        else
        {
            for ( i = 1; i <= Abc_MinInt(p->pPars->nFramesPast, f); i++ )
                Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vCores, f-i), i );
        }

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 ) // resource limit is reached
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            // check timeout
            if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit )
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            if ( vCore != NULL )
            {
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            }
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;
            // perform the refinement
            clk2 = Abc_Clock();
            pCex = Vta_ManRefineAbstraction( p, f );
            p->timeCex += Abc_Clock() - clk2;
            if ( pCex != NULL )
                goto finish;
            // print the result (do not count it towards change)
            Vta_ManAbsPrintFrame( p, NULL, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose );
        }
        assert( Status == 1 );
        // valid core is obtained
        Vta_ManUnsatCoreRemap( p, vCore );
        Vec_IntSort( vCore, 1 );
        // update the SAT solver
        sat_solver2_rollback( p->pSat );
        // update storage
        Vga_ManRollBack( p, nObjOld );
        // load this timeframe
        Vga_ManLoadSlice( p, vCore, 0 );
        Vec_IntFree( vCore );

        // run SAT solver
        clk2 = Abc_Clock();
        vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
        p->timeUnsat += Abc_Clock() - clk2;
        assert( (vCore != NULL) == (Status == 1) );
        if ( Status == -1 ) // resource limit is reached
            break;
        if ( Status == 0 )
        {
            Vta_ManSatVerify( p );
            // make sure, there was no initial abstraction (otherwise, it was invalid)
            assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
            pCex = Vga_ManDeriveCex( p );
            break;
        }
        // add the core
        Vta_ManUnsatCoreRemap( p, vCore );
        // add in direct topological order
        Vec_IntSort( vCore, 1 );
        Vec_PtrPush( p->vCores, vCore );
        // print the result
        if ( Vta_ManAbsPrintFrame( p, vCore, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose ) )
        {
            // reset the counter of frames without change
            nCountNoChange = 1;
            p->pPars->nFramesNoChange = 0;
        }
        else if ( ++nCountNoChange == 2 ) // time to send
        {
            p->pPars->nFramesNoChange++;
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_VtaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_VtaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }
        }
        // dump the model
        if ( p->pPars->fDumpVabs && (f & 1) )
        {
            char Command[1000];
            Abc_FrameSetStatus( -1 );
            Abc_FrameSetCex( NULL );
            Abc_FrameSetNFrames( f+1 );
            sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "vtabs.aig"), ".status") );
            Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
            Gia_VtaDumpAbsracted( p, pPars->fVerbose );
        }
        // check if the number of objects is below limit
        if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
        if ( Vec_PtrSize(p->vCores) == 0 )
            Abc_Print( 1, "Abstraction is not produced because first frame is not solved.  " );
        else
        {
            assert( Vec_PtrSize(p->vCores) > 0 );
//            if ( pAig->vObjClasses != NULL )
//                Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
            Vec_IntFreeP( &pAig->vObjClasses );
            pAig->vObjClasses = Gia_VtaFramesToAbs( (Vec_Vec_t *)p->vCores );
            if ( Status == -1 )
            {
                if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                    Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
                else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                    Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
                else if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
                    Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
                else
                    Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
            }
            else
            {
                p->pPars->iFrame++;
                Abc_Print( 1, "VTA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
            }
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( p->pGia->pCexSeq );
        p->pGia->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( p->pGia, pCex, 0 ) )
            Abc_Print( 1, "    Gia_VtaPerform(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vObjClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex;
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gia_VtaPrintMemory( p );
    }

    Vga_ManStop( p );
    fflush( stdout );
    return RetValue;
}